

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLocusArcIntersect.cpp
# Opt level: O2

int TestLocusArcIntersect(string *sFilePath)

{
  bool bVar1;
  char *pcVar2;
  byte bVar3;
  failure e;
  undefined1 local_2e8 [16];
  string sLine3;
  string sLine2;
  string local_298;
  string local_278;
  string local_258;
  ifstream infile;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&infile);
  std::ios::exceptions((int)&infile + (int)*(undefined8 *)(_infile + -0x18));
  _e = local_2e8;
  local_2e8[0] = 0;
  sLine2._M_dataplus._M_p = (pointer)&sLine2.field_2;
  sLine2._M_string_length = 0;
  sLine3._M_dataplus._M_p = (pointer)&sLine3.field_2;
  sLine3._M_string_length = 0;
  sLine2.field_2._M_local_buf[0] = '\0';
  sLine3.field_2._M_local_buf[0] = '\0';
  std::ifstream::open((char *)&infile,(_Ios_Openmode)(sFilePath->_M_dataplus)._M_p);
  bVar3 = 1;
  while ((abStack_218[*(long *)(_infile + -0x18)] & 2) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&infile,(string *)&e);
    pcVar2 = (char *)std::__cxx11::string::at((ulong)&e);
    if (*pcVar2 != '#') {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&infile,(string *)&sLine2);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&infile,(string *)&sLine3);
      std::__cxx11::string::string((string *)&local_258,(string *)&e);
      std::__cxx11::string::string((string *)&local_278,(string *)&sLine2);
      std::__cxx11::string::string((string *)&local_298,(string *)&sLine3);
      bVar1 = ParseLocusArcIntersect(&local_258,&local_278,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_258);
      if (!bVar1) {
        bVar3 = 0;
      }
    }
  }
  std::ifstream::close();
  std::__cxx11::string::~string((string *)&sLine3);
  std::__cxx11::string::~string((string *)&sLine2);
  std::__cxx11::string::~string((string *)&e);
  std::ifstream::~ifstream(&infile);
  return (uint)bVar3;
}

Assistant:

int TestLocusArcIntersect(const string &sFilePath)
{
    ifstream infile;
    infile.exceptions(ifstream::eofbit | ifstream::failbit | ifstream::badbit);
    int nCount = 0;
    int nCommentCount = 0;
    bool bPassed = true;
    try
    {
        string sLine1, sLine2, sLine3;
        infile.open(sFilePath.c_str(), ifstream::in);

        while (!infile.eof())
        {
            getline(infile, sLine1);
            if (sLine1.at(0) == '#')
            {
                nCommentCount++;
            }
            else
            {
                getline(infile, sLine2);
                getline(infile, sLine3);
                if (!ParseLocusArcIntersect(sLine1, sLine2, sLine3))
                    bPassed = false;
                nCount++;
            }
        }
        infile.close();
        return bPassed;
    }

    catch (ifstream::failure e)
    {
        int nError = -99;
        // Per C++ standards for ifstream::failbit with global function getline
        // No characters were extracted because the end was prematurely found.Notice
        // that some eofbit cases will also set failbit.
        // In this case the end of the file is read and causes both flags to be raised,
        // so this presumably means all the data has been read correctly.
        if ((infile.rdstate() & ifstream::failbit) && (infile.rdstate() & ifstream::eofbit) != 0)
            nError = bPassed;
        else if ((infile.rdstate() & ifstream::failbit) != 0)
            nError = -1;
        else if ((infile.rdstate() & ifstream::badbit) != 0)
            nError = -2;
        else if ((infile.rdstate() & ifstream::eofbit) != 0)
            nError = -3;
        if (infile.is_open())
            infile.close();
        return nError;
    }
}